

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_and(void **param_1)

{
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *r_00;
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *r3;
  roaring64_bitmap_t *r2;
  roaring64_bitmap_t *r1;
  roaring64_bitmap_t *in_stack_00000060;
  roaring64_bitmap_t *in_stack_00000118;
  roaring64_bitmap_t *in_stack_00000120;
  int in_stack_ffffffffffffffdc;
  
  r = roaring64_bitmap_create();
  r_00 = roaring64_bitmap_create();
  roaring64_bitmap_add(r,(uint64_t)r_00);
  roaring64_bitmap_add(r,(uint64_t)r_00);
  roaring64_bitmap_add(r,(uint64_t)r_00);
  roaring64_bitmap_add(r,(uint64_t)r_00);
  roaring64_bitmap_add(r,(uint64_t)r_00);
  roaring64_bitmap_add(r,(uint64_t)r_00);
  roaring64_bitmap_add(r,(uint64_t)r_00);
  b = roaring64_bitmap_and(in_stack_00000120,in_stack_00000118);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_contains(r_00,(uint64_t)b);
  _assert_true((unsigned_long)r,(char *)r_00,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_contains(r_00,(uint64_t)b);
  _assert_true((unsigned_long)r,(char *)r_00,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_contains(r_00,(uint64_t)b);
  _assert_true((unsigned_long)r,(char *)r_00,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_contains(r_00,(uint64_t)b);
  _assert_true((unsigned_long)r,(char *)r_00,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_contains(r_00,(uint64_t)b);
  _assert_true((unsigned_long)r,(char *)r_00,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_free(in_stack_00000060);
  roaring64_bitmap_free(in_stack_00000060);
  roaring64_bitmap_free(in_stack_00000060);
  return;
}

Assistant:

DEFINE_TEST(test_and) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    roaring64_bitmap_t* r2 = roaring64_bitmap_create();

    roaring64_bitmap_add(r1, 100000);
    roaring64_bitmap_add(r1, 100001);
    roaring64_bitmap_add(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    roaring64_bitmap_add(r2, 100001);
    roaring64_bitmap_add(r2, 200000);
    roaring64_bitmap_add(r2, 400000);

    roaring64_bitmap_t* r3 = roaring64_bitmap_and(r1, r2);

    assert_r64_valid(r3);
    assert_false(roaring64_bitmap_contains(r3, 100000));
    assert_true(roaring64_bitmap_contains(r3, 100001));
    assert_true(roaring64_bitmap_contains(r3, 200000));
    assert_false(roaring64_bitmap_contains(r3, 300000));
    assert_false(roaring64_bitmap_contains(r3, 400000));

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
    roaring64_bitmap_free(r3);
}